

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::BuildHandlerScope
               (Var argThis,RecyclableObject *hostObject,FrameDisplay *pDisplay,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  ushort uVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  uint16 uVar5;
  uint16 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  undefined4 *puVar9;
  JavascriptLibrary *this;
  Recycler *pRVar10;
  ScriptContext *this_00;
  Var item;
  JavascriptNumberObject *local_a0;
  Var aParentWrapped;
  TrackAllocData local_78;
  ScriptContext *local_50;
  FrameDisplay *tmp;
  Var aParent;
  RecyclableObject *pRStack_38;
  uint16 length;
  Var aChild;
  ScriptContext *pSStack_28;
  uint16 i;
  ScriptContext *scriptContext_local;
  FrameDisplay *pDisplay_local;
  RecyclableObject *hostObject_local;
  Var argThis_local;
  
  pSStack_28 = scriptContext;
  scriptContext_local = (ScriptContext *)pDisplay;
  pDisplay_local = (FrameDisplay *)hostObject;
  hostObject_local = (RecyclableObject *)argThis;
  if (argThis == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b5e,"(argThis != nullptr)","argThis != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pSVar3 = scriptContext_local;
  bVar4 = TaggedNumber::Is(hostObject_local);
  if (bVar4) {
    this = ScriptContext::GetLibrary(pSStack_28);
    local_a0 = JavascriptLibrary::CreateNumberObject(this,hostObject_local);
  }
  else {
    local_a0 = (JavascriptNumberObject *)ToUnscopablesWrapperObject(hostObject_local,pSStack_28);
  }
  FrameDisplay::SetItem((FrameDisplay *)pSVar3,0,local_a0);
  aChild._6_2_ = 1;
  pRStack_38 = hostObject_local;
  aParent._6_2_ = FrameDisplay::GetLength((FrameDisplay *)scriptContext_local);
  do {
    if (pRStack_38 == (RecyclableObject *)0x0) {
LAB_00fa40ab:
      uVar2 = aChild._6_2_;
      uVar6 = FrameDisplay::GetLength((FrameDisplay *)scriptContext_local);
      if (uVar6 < uVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1b7f,"(i <= pDisplay->GetLength())",
                                    "i <= pDisplay->GetLength()");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      FrameDisplay::SetLength((FrameDisplay *)scriptContext_local,aChild._6_2_);
      return;
    }
    tmp = (FrameDisplay *)(**(code **)((long)*pDisplay_local + 0x270))(pDisplay_local,pRStack_38);
    if (tmp == (FrameDisplay *)0x0) {
      tmp = (FrameDisplay *)0x0;
      goto LAB_00fa40ab;
    }
    tmp = (FrameDisplay *)CrossSite::MarshalVar(pSStack_28,tmp,false);
    if (aChild._6_2_ == aParent._6_2_) {
      aParent._6_2_ = UInt16Math::Add(aParent._6_2_,8);
      pRVar10 = ScriptContext::GetRecycler(pSStack_28);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&FrameDisplay::typeinfo,(ulong)aParent._6_2_ << 3,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                 ,0x1b73);
      pRVar10 = Memory::Recycler::TrackAllocInfo(pRVar10,&local_78);
      this_00 = (ScriptContext *)new<Memory::Recycler>(8,pRVar10,0x446fd0,0);
      FrameDisplay::FrameDisplay((FrameDisplay *)this_00,aParent._6_2_,false);
      local_50 = this_00;
      uVar7 = FrameDisplay::GetOffsetOfScopes();
      uVar6 = FrameDisplay::GetLength((FrameDisplay *)local_50);
      pSVar3 = scriptContext_local;
      uVar8 = FrameDisplay::GetOffsetOfScopes();
      uVar5 = FrameDisplay::GetLength((FrameDisplay *)scriptContext_local);
      js_memcpy_s((Type *)((long)&(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo +
                          (ulong)uVar7),(ulong)uVar6 << 3,
                  (void *)((long)&(pSVar3->super_ScriptContextInfo)._vptr_ScriptContextInfo +
                          (ulong)uVar8),(ulong)uVar5 << 3);
      scriptContext_local = local_50;
    }
    item = ToUnscopablesWrapperObject(tmp,pSStack_28);
    FrameDisplay::SetItem((FrameDisplay *)scriptContext_local,(uint)aChild._6_2_,item);
    pRStack_38 = (RecyclableObject *)tmp;
    aChild._6_2_ = aChild._6_2_ + 1;
  } while( true );
}

Assistant:

void JavascriptOperators::BuildHandlerScope(Var argThis, RecyclableObject * hostObject, FrameDisplay * pDisplay, ScriptContext * scriptContext)
    {
        // Event handlers need implicit lookups of @@unscopables on parent scopes.
        // We can intercept the property accesses by wrapping the object with the unscopables handler.
        // WebIDL: https://heycam.github.io/webidl/#ref-for-Unscopable

        Assert(argThis != nullptr);
        pDisplay->SetItem(0, TaggedNumber::Is(argThis) ? scriptContext->GetLibrary()->CreateNumberObject(argThis) : ToUnscopablesWrapperObject(argThis, scriptContext));
        uint16 i = 1;

        Var aChild = argThis;
        uint16 length = pDisplay->GetLength();

        // Now add any parent scopes
        // We need to support the namespace parent lookup in both fastDOM on and off scenario.
        while (aChild != NULL)
        {
            Var aParent = hostObject->GetNamespaceParent(aChild);

            if (aParent == nullptr)
            {
                break;
            }
            aParent = CrossSite::MarshalVar(scriptContext, aParent);
            if (i == length)
            {
                length = UInt16Math::Add(length, 8);
                FrameDisplay * tmp = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                js_memcpy_s((char*)tmp + tmp->GetOffsetOfScopes(), tmp->GetLength() * sizeof(void *), (char*)pDisplay + pDisplay->GetOffsetOfScopes(), pDisplay->GetLength() * sizeof(void*));
                pDisplay = tmp;
            }

            Var aParentWrapped = ToUnscopablesWrapperObject(aParent, scriptContext);
            pDisplay->SetItem(i, aParentWrapped);

            aChild = aParent;
            i++;
        }

        Assert(i <= pDisplay->GetLength());
        pDisplay->SetLength(i);
    }